

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O0

int32_t __thiscall icu_63::CollationKey::hashCode(CollationKey *this)

{
  int32_t iVar1;
  uint8_t *key;
  CollationKey *this_local;
  
  if (this->fHashCode == 0) {
    key = getBytes(this);
    iVar1 = getLength(this);
    iVar1 = computeHashCode(key,iVar1);
    this->fHashCode = iVar1;
  }
  return this->fHashCode;
}

Assistant:

int32_t
CollationKey::hashCode() const
{
    // (Cribbed from UnicodeString)
    // We cache the hashCode; when it becomes invalid, due to any change to the
    // string, we note this by setting it to kInvalidHashCode. [LIU]

    // Note: This method is semantically const, but physically non-const.

    if (fHashCode == kInvalidHashCode)
    {
        fHashCode = computeHashCode(getBytes(), getLength());
    }

    return fHashCode;
}